

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * google::protobuf::internal::FixedParser<unsigned_int>
                 (void *object,char *ptr,ParseContext *ctx)

{
  uint32 size;
  char *pcVar1;
  char *local_20;
  
  local_20 = ptr;
  size = ReadSize(&local_20);
  if (local_20 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                       (&ctx->super_EpsCopyInputStream,local_20,size,
                        (RepeatedField<unsigned_int> *)object);
  }
  return pcVar1;
}

Assistant:

const char* FixedParser(void* object, const char* ptr, ParseContext* ctx) {
  int size = ReadSize(&ptr);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ctx->ReadPackedFixed(ptr, size,
                              static_cast<RepeatedField<T>*>(object));
}